

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O0

void __thiscall HEkk::timeReporting(HEkk *this,HighsInt save_mod_recover)

{
  int in_ESI;
  HighsLogOptions *in_RDI;
  HighsInt log_dev_level;
  bool log_to_console;
  bool output_flag;
  HighsLogOptions log_options;
  bool non_null_report;
  SimplexTimer simplex_timer;
  double in_stack_000000a0;
  HighsTimerClock *in_stack_000000a8;
  SimplexTimer *in_stack_000000b0;
  bool in_stack_000001af;
  HighsSimplexInfo *in_stack_000001b0;
  HighsInt in_stack_000001bc;
  HighsLogOptions *in_stack_000001c0;
  undefined4 local_78;
  undefined1 local_72;
  undefined1 local_71;
  undefined8 local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined4 *local_58;
  undefined1 local_e;
  
  if (in_ESI == -1) {
    timeReporting::highs_analysis_level = *(HighsInt *)(in_RDI->output_flag + 0x160);
  }
  else if (in_ESI == 0) {
    if ((timeReporting::highs_analysis_level & 8U) == 0) {
      *(int *)(in_RDI->output_flag + 0x160) = *(int *)(in_RDI->output_flag + 0x160) + 8;
    }
  }
  else {
    *(HighsInt *)(in_RDI->output_flag + 0x160) = timeReporting::highs_analysis_level;
    std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>::operator[]
              ((vector<HighsTimerClock,_std::allocator<HighsTimerClock>_> *)
               &in_RDI->user_log_callback,0);
    local_e = SimplexTimer::reportSimplexInnerClock
                        (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
    *(bool *)((long)&in_RDI[2].user_callback._M_invoker + 3) =
         (*(uint *)(in_RDI->output_flag + 0x160) & 8) != 0;
    if ((bool)local_e) {
      HighsLogOptions::HighsLogOptions(in_RDI);
      local_71 = 1;
      local_72 = 0;
      local_78 = 3;
      local_70 = _stdout;
      local_68 = &local_71;
      local_60 = &local_72;
      local_58 = &local_78;
      reportSimplexPhaseIterations
                (in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001af);
      HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x77cdfb);
    }
  }
  return;
}

Assistant:

void HEkk::timeReporting(const HighsInt save_mod_recover) {
  static HighsInt highs_analysis_level;
  if (save_mod_recover == -1) {
    highs_analysis_level = options_->highs_analysis_level;
  } else if (save_mod_recover == 0) {
    // Ensure that kHighsAnalysisLevelSolverTime is set
    if (!(kHighsAnalysisLevelSolverTime & highs_analysis_level))
      this->options_->highs_analysis_level += kHighsAnalysisLevelSolverTime;
  } else {
    options_->highs_analysis_level = highs_analysis_level;
    SimplexTimer simplex_timer;
    const bool non_null_report = simplex_timer.reportSimplexInnerClock(
        this->analysis_.thread_simplex_clocks[0], 20);
    this->analysis_.analyse_simplex_time =
        kHighsAnalysisLevelSolverTime & options_->highs_analysis_level;
    if (non_null_report) {
      HighsLogOptions log_options;
      bool output_flag = true;
      bool log_to_console = false;
      HighsInt log_dev_level = kHighsLogDevLevelVerbose;
      log_options.log_stream = stdout;
      log_options.output_flag = &output_flag;
      log_options.log_to_console = &log_to_console;
      log_options.log_dev_level = &log_dev_level;
      reportSimplexPhaseIterations(log_options, this->iteration_count_,
                                   this->info_);
    }
  }
}